

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUAccelCal.cpp
# Opt level: O1

bool __thiscall RTIMUAccelCal::accelCalSave(RTIMUAccelCal *this)

{
  float *pfVar1;
  float fVar2;
  RTIMUSettings *pRVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = true;
  lVar4 = -0xc;
  do {
    fVar2 = *(float *)((long)(this->m_accelMax).m_data + lVar4);
    pfVar1 = (float *)((long)(this->m_averageValue).m_data + lVar4);
    if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
      bVar5 = false;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  if (bVar5) {
    pRVar3 = this->m_settings;
    pRVar3->m_accelCalValid = true;
    RTVector3::operator=(&pRVar3->m_accelCalMin,&this->m_accelMin);
    RTVector3::operator=(&this->m_settings->m_accelCalMax,&this->m_accelMax);
    (*(this->m_settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
  }
  return bVar5;
}

Assistant:

bool RTIMUAccelCal::accelCalSave()
{
    if (!accelCalValid())
        return false;

    m_settings->m_accelCalValid = true;
    m_settings->m_accelCalMin = m_accelMin;
    m_settings->m_accelCalMax = m_accelMax;
    m_settings->saveSettings();
    return true;
}